

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockIndex.h
# Opt level: O1

void __thiscall
adios2::query::BlockIndex<long_double>::RunStatMinBlocksInfo
          (BlockIndex<long_double> *this,QueryVar *query,MinVarInfo *MinBlocksInfo,
          vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *hitBlocks)

{
  pointer pMVar1;
  size_t *psVar2;
  size_t *psVar3;
  MinVarInfo *pMVar4;
  bool bVar5;
  long lVar6;
  pointer pMVar7;
  long lVar8;
  Dims ss;
  Dims cc;
  Box<adios2::Dims> box;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  MinVarInfo *local_d0;
  BlockIndex<long_double> *local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  longdouble local_a8;
  longdouble local_98;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_80;
  BlockHit local_50;
  
  pMVar7 = (MinBlocksInfo->BlocksInfo).
           super__Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar1 = (MinBlocksInfo->BlocksInfo).
           super__Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar7 != pMVar1) {
    local_d0 = MinBlocksInfo;
    local_c8 = this;
    do {
      local_98 = (pMVar7->MinMax).MinUnion.field_ldouble;
      local_a8 = (pMVar7->MinMax).MaxUnion.field_ldouble;
      bVar5 = RangeTree::CheckInterval<long_double>(&query->m_RangeTree,&local_98,&local_a8);
      pMVar4 = local_d0;
      if (bVar5) {
        if ((local_c8->m_VarPtr->super_VariableBase).m_ShapeID == LocalArray) {
          BlockHit::BlockHit((BlockHit *)&local_80,pMVar7->BlockID);
          std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::
          emplace_back<adios2::query::BlockHit>(hitBlocks,(BlockHit *)&local_80);
          std::
          vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          ::~vector((vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                     *)&local_80.first.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish);
        }
        else {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_e8,(long)local_d0->Dims,(allocator_type *)&local_80);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_c0,(long)pMVar4->Dims,(allocator_type *)&local_80);
          if ((long)local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start != 0) {
            lVar6 = (long)local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3;
            psVar2 = pMVar7->Start;
            psVar3 = pMVar7->Count;
            lVar8 = 0;
            do {
              local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8] = psVar2[lVar8];
              local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8] = psVar3[lVar8];
              lVar8 = lVar8 + 1;
            } while (lVar6 + (ulong)(lVar6 == 0) != lVar8);
          }
          bVar5 = QueryVar::TouchSelection(query,&local_e8,&local_c0);
          if (bVar5) {
            std::
            pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::
            pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_true>
                      (&local_80,&local_e8,&local_c0);
            BlockHit::BlockHit(&local_50,pMVar7->BlockID,&local_80);
            std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::
            emplace_back<adios2::query::BlockHit>(hitBlocks,&local_50);
            std::
            vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ::~vector(&local_50.m_Regions);
            if (local_80.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_80.second.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_80.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_80.first.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
          }
          if (local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
      pMVar7 = pMVar7 + 1;
    } while (pMVar7 != pMVar1);
  }
  return;
}

Assistant:

void RunStatMinBlocksInfo(const QueryVar &query, const adios2::MinVarInfo *MinBlocksInfo,
                              std::vector<BlockHit> &hitBlocks)
    {
        for (auto &blockInfo : MinBlocksInfo->BlocksInfo)
        {
            T bmin = *(T *)&blockInfo.MinMax.MinUnion;
            T bmax = *(T *)&blockInfo.MinMax.MaxUnion;
            bool isHit = query.m_RangeTree.CheckInterval(bmin, bmax);

            if (!isHit)
                continue;

            if (m_VarPtr->m_ShapeID != adios2::ShapeID::LocalArray)
            {
                Dims ss(MinBlocksInfo->Dims);
                Dims cc(MinBlocksInfo->Dims);
                for (std::vector<int>::size_type i = 0; i < ss.size(); i++)
                {
                    ss[i] = blockInfo.Start[i];
                    cc[i] = blockInfo.Count[i];
                }
                if (!query.TouchSelection(ss, cc))
                    continue;

                if (isHit)
                {
                    adios2::Box<adios2::Dims> box = {ss, cc};
                    hitBlocks.push_back(BlockHit(blockInfo.BlockID, box));
                }
            }
            else
            { // local array
                hitBlocks.push_back(BlockHit(blockInfo.BlockID));
            }
        }
    }